

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void q_createNativeChildrenAndSetParent(QWidget *parentWidget)

{
  QWidgetData **ppQVar1;
  long lVar2;
  QArrayData *pQVar3;
  long lVar4;
  QWindow *pQVar5;
  QWidget *pQVar6;
  long lVar7;
  QWidget *pQVar8;
  QWidgetPrivate *d;
  long lVar9;
  
  lVar2 = *(long *)&parentWidget->field_0x8;
  pQVar3 = *(QArrayData **)(lVar2 + 0x18);
  lVar4 = *(long *)(lVar2 + 0x20);
  lVar2 = *(long *)(lVar2 + 0x28);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar2 != 0) {
    lVar9 = 0;
    do {
      if (((*(byte *)(*(long *)(*(long *)(lVar4 + lVar9 * 8) + 8) + 0x30) & 1) != 0) &&
         (pQVar6 = (QWidget *)QMetaObject::cast((QObject *)&QWidget::staticMetaObject),
         pQVar6 != (QWidget *)0x0)) {
        lVar7 = *(long *)&pQVar6->field_0x8;
        if ((*(byte *)(lVar7 + 0x248) & 0x10) == 0) {
          q_createNativeChildrenAndSetParent(pQVar6);
        }
        else {
          if (pQVar6->data->winid == 0) {
            QWidget::winId(pQVar6);
            lVar7 = *(long *)&pQVar6->field_0x8;
          }
          if (((*(long *)(lVar7 + 0x78) != 0) &&
              (lVar7 = *(long *)(*(long *)(lVar7 + 0x78) + 8), lVar7 != 0)) &&
             (pQVar5 = *(QWindow **)(lVar7 + 0x20), pQVar5 != (QWindow *)0x0)) {
            pQVar8 = parentWidget;
            if (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
              do {
                pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
                if (pQVar6 == (QWidget *)0x0) break;
              } while (pQVar6->data->winid == 0);
              QWindow::setParent(pQVar5);
            }
            else {
              do {
                pQVar6 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
                if (pQVar6 == (QWidget *)0x0) break;
                ppQVar1 = &pQVar8->data;
                pQVar8 = pQVar6;
              } while ((((*ppQVar1)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
              QWindow::setTransientParent(pQVar5);
            }
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar2);
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

void q_createNativeChildrenAndSetParent(const QWidget *parentWidget)
{
    QObjectList children = parentWidget->children();
    for (int i = 0; i < children.size(); i++) {
        if (children.at(i)->isWidgetType()) {
            const QWidget *childWidget = qobject_cast<const QWidget *>(children.at(i));
            if (childWidget) { // should not be necessary
                if (childWidget->testAttribute(Qt::WA_NativeWindow)) {
                    if (!childWidget->internalWinId())
                        childWidget->winId();
                    if (childWidget->windowHandle()) {
                        if (childWidget->isWindow()) {
                            childWidget->windowHandle()->setTransientParent(parentWidget->window()->windowHandle());
                        } else {
                            childWidget->windowHandle()->setParent(childWidget->nativeParentWidget()->windowHandle());
                        }
                    }
                } else {
                    q_createNativeChildrenAndSetParent(childWidget);
                }
            }
        }
    }

}